

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::PRandBit::forward(PRandBit *this)

{
  bool bVar1;
  int iVar2;
  Mat *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  int iVar3;
  Mat *in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff40;
  Mat *in_stack_ffffffffffffff48;
  Mat *in_stack_ffffffffffffff50;
  Mat *in_stack_ffffffffffffff58;
  Mat *in_stack_ffffffffffffff60;
  Mat *in_stack_ffffffffffffff68;
  ll128 *in_stack_ffffffffffffff90;
  Mat *in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffe8;
  
  Op::reinit((Op *)in_RDI);
  iVar3 = in_RDI->order;
  if (iVar3 == 1) {
    (**(code **)**(undefined8 **)(in_RDI + 1))();
    bVar1 = Op::forwardHasNext(*(Op **)(in_RDI + 1));
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
  }
  else if (iVar3 == 2) {
    (**(code **)**(undefined8 **)&in_RDI[1].order)();
    bVar1 = Op::forwardHasNext(*(Op **)&in_RDI[1].order);
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
  }
  else if (iVar3 == 3) {
    iVar2 = Mat::count(in_RDI);
    if (iVar2 < 4) {
      Mat::fill(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40);
      Mat::sqrt_inv(in_stack_ffffffffffffffe8);
      Mat::operator=(in_stack_ffffffffffffff30,(Mat *)CONCAT44(iVar3,in_stack_ffffffffffffff28));
      Mat::~Mat((Mat *)0x1272d2);
      Mat::dot(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      Mat::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      Mat::operator=(in_stack_ffffffffffffff30,(Mat *)CONCAT44(iVar3,in_stack_ffffffffffffff28));
      Mat::~Mat((Mat *)0x12733e);
      Mat::~Mat((Mat *)0x127348);
      Mat::divideBy2(in_stack_ffffffffffffff68);
      Mat::operator=(in_stack_ffffffffffffff30,(Mat *)CONCAT44(iVar3,in_stack_ffffffffffffff28));
      Mat::~Mat((Mat *)0x12737d);
    }
    else {
      in_RDI->order = 0;
    }
  }
  return;
}

Assistant:

void MathOp::PRandBit::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            pRandFld->forward();
            if (pRandFld->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 2:
            mulPub->forward();
            if (mulPub->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 3:
            if (a2_r->count() > REDUNDANCY) {
                forwardRound = 0;
                break;
            }
            Mat::fill(a2, a2_r, a, a_r);
            *a2 = a2->sqrt_inv();
            *a2 = a2->dot(*a) + 1;
            *res = a2->divideBy2();
            break;
    }
}